

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O3

QScreen * QWidgetPrivate::screen(QWidget *widget,QPoint *globalPosition,bool hasPosition)

{
  QWidget *widget_00;
  QPoint QVar1;
  QScreen *pQVar2;
  
  do {
    widget_00 = widget;
    widget = parentGraphicsView(widget_00);
  } while (widget != (QWidget *)0x0);
  if (hasPosition) {
    QVar1 = (QPoint)QWidget::screen(widget_00);
    pQVar2 = (QScreen *)QScreen::virtualSiblingAt(QVar1);
    if (pQVar2 != (QScreen *)0x0) {
      return pQVar2;
    }
  }
  pQVar2 = QWidget::screen(widget_00);
  return pQVar2;
}

Assistant:

static QScreen *screen(const QWidget *widget, const QPoint &globalPosition, bool hasPosition = true)
    {
        while (QWidget *view = parentGraphicsView(widget))
            widget = view;

        QScreen *screen = nullptr;
        if (hasPosition)
            screen = widget->screen()->virtualSiblingAt(globalPosition);
        if (!screen)
            screen = widget->screen();

        return screen;
    }